

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O2

void __thiscall OpenMD::RhoR::writeRhoR(RhoR *this)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  ofstream rdfStream;
  
  std::ofstream::ofstream
            (&rdfStream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"RhoR: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<((ostream *)&rdfStream,"#radial density function rho(r)\n");
    std::operator<<((ostream *)&rdfStream,"#r\tcorrValue\n");
    for (uVar3 = 0; uVar4 = (ulong)uVar3,
        uVar4 < (ulong)((long)(this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<double>(((double)uVar4 + 0.5) * this->deltaR_);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4] /
                          (double)this->nProcessed_);
      std::operator<<(poVar2,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  return;
}

Assistant:

void RhoR::writeRhoR() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#radial density function rho(r)\n";
      rdfStream << "#r\tcorrValue\n";
      for (unsigned int i = 0; i < avgRhoR_.size(); ++i) {
        RealType r = deltaR_ * (i + 0.5);
        rdfStream << r << "\t" << avgRhoR_[i] / nProcessed_ << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RhoR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }